

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

size_t ra_portable_size_in_bytes(roaring_array_t *ra)

{
  uint32_t uVar1;
  int32_t iVar2;
  size_t sVar3;
  int32_t k;
  long lVar4;
  
  uVar1 = ra_portable_header_size(ra);
  sVar3 = (size_t)uVar1;
  for (lVar4 = 0; lVar4 < ra->size; lVar4 = lVar4 + 1) {
    iVar2 = container_size_in_bytes(ra->containers[lVar4],ra->typecodes[lVar4]);
    sVar3 = sVar3 + (long)iVar2;
  }
  return sVar3;
}

Assistant:

size_t ra_portable_size_in_bytes(const roaring_array_t *ra) {
    size_t count = ra_portable_header_size(ra);

    for (int32_t k = 0; k < ra->size; ++k) {
        count += container_size_in_bytes(ra->containers[k], ra->typecodes[k]);
    }
    return count;
}